

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::NetStateRule::SerializeWithCachedSizes(NetStateRule *this,CodedOutputStream *output)

{
  uint uVar1;
  Phase value;
  int32 iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  string *psVar6;
  UnknownFieldSet *unknown_fields;
  int local_48;
  int n_1;
  int i_1;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  NetStateRule *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    value = phase(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(1,value,output);
  }
  if ((uVar1 & 2) != 0) {
    iVar2 = min_level(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(2,iVar2,output);
  }
  if ((uVar1 & 4) != 0) {
    iVar2 = max_level(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(3,iVar2,output);
  }
  i_1 = 0;
  iVar3 = stage_size(this);
  for (; i_1 < iVar3; i_1 = i_1 + 1) {
    stage_abi_cxx11_(this,i_1);
    pcVar5 = (char *)std::__cxx11::string::data();
    stage_abi_cxx11_(this,i_1);
    iVar4 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar4,SERIALIZE,"caffe.NetStateRule.stage");
    psVar6 = stage_abi_cxx11_(this,i_1);
    google::protobuf::internal::WireFormatLite::WriteString(4,psVar6,output);
  }
  local_48 = 0;
  iVar3 = not_stage_size(this);
  for (; local_48 < iVar3; local_48 = local_48 + 1) {
    not_stage_abi_cxx11_(this,local_48);
    pcVar5 = (char *)std::__cxx11::string::data();
    not_stage_abi_cxx11_(this,local_48);
    iVar4 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar4,SERIALIZE,"caffe.NetStateRule.not_stage");
    psVar6 = not_stage_abi_cxx11_(this,local_48);
    google::protobuf::internal::WireFormatLite::WriteString(5,psVar6,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = NetStateRule::unknown_fields(this);
    google::protobuf::internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void NetStateRule::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.NetStateRule)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.Phase phase = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->phase(), output);
  }

  // optional int32 min_level = 2;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(2, this->min_level(), output);
  }

  // optional int32 max_level = 3;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(3, this->max_level(), output);
  }

  // repeated string stage = 4;
  for (int i = 0, n = this->stage_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->stage(i).data(), this->stage(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.NetStateRule.stage");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      4, this->stage(i), output);
  }

  // repeated string not_stage = 5;
  for (int i = 0, n = this->not_stage_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->not_stage(i).data(), this->not_stage(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.NetStateRule.not_stage");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      5, this->not_stage(i), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.NetStateRule)
}